

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

nng_err nni_http_handler_init_static
                  (nni_http_handler **hpp,char *uri,void *data,size_t size,char *ctype)

{
  nng_err nVar1;
  undefined8 *data_00;
  char *pcVar2;
  void *pvVar3;
  http_static *hs;
  nni_http_handler *pnStack_40;
  nng_err rv;
  nni_http_handler *h;
  char *ctype_local;
  size_t size_local;
  void *data_local;
  char *uri_local;
  nni_http_handler **hpp_local;
  
  h = (nni_http_handler *)ctype;
  ctype_local = (char *)size;
  size_local = (size_t)data;
  data_local = uri;
  uri_local = (char *)hpp;
  data_00 = (undefined8 *)nni_zalloc(0x18);
  if (data_00 == (undefined8 *)0x0) {
    return NNG_ENOMEM;
  }
  pcVar2 = nni_strdup((char *)h);
  data_00[2] = pcVar2;
  if (pcVar2 == (char *)0x0) {
LAB_0014b840:
    http_static_free(data_00);
    hpp_local._4_4_ = NNG_ENOMEM;
  }
  else {
    if (ctype_local != (char *)0x0) {
      pvVar3 = nni_alloc((size_t)ctype_local);
      *data_00 = pvVar3;
      if (pvVar3 == (void *)0x0) goto LAB_0014b840;
    }
    data_00[1] = ctype_local;
    memcpy((void *)*data_00,(void *)size_local,(size_t)ctype_local);
    nVar1 = nni_http_handler_init(&stack0xffffffffffffffc0,(char *)data_local,http_handle_static);
    if (nVar1 == NNG_OK) {
      nni_http_handler_set_data(pnStack_40,data_00,http_static_free);
      nni_http_handler_collect_body(pnStack_40,true,0);
      *(nni_http_handler **)uri_local = pnStack_40;
      hpp_local._4_4_ = NNG_OK;
    }
    else {
      http_static_free(data_00);
      hpp_local._4_4_ = nVar1;
    }
  }
  return hpp_local._4_4_;
}

Assistant:

nng_err
nni_http_handler_init_static(nni_http_handler **hpp, const char *uri,
    const void *data, size_t size, const char *ctype)
{
	nni_http_handler *h;
	nng_err           rv;
	http_static      *hs;

	if ((hs = NNI_ALLOC_STRUCT(hs)) == NULL) {
		return (NNG_ENOMEM);
	}
	if (((hs->ctype = nni_strdup(ctype)) == NULL) ||
	    ((size > 0) && ((hs->data = nni_alloc(size)) == NULL))) {
		http_static_free(hs);
		return (NNG_ENOMEM);
	}
	hs->size = size;
	memcpy(hs->data, data, size);

	if ((rv = nni_http_handler_init(&h, uri, http_handle_static)) != 0) {
		http_static_free(hs);
		return (rv);
	}

	nni_http_handler_set_data(h, hs, http_static_free);

	// We don't permit a body for getting static data.
	nni_http_handler_collect_body(h, true, 0);

	*hpp = h;
	return (NNG_OK);
}